

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraBmc.c
# Opt level: O3

void Fra_BmcFilterImplications(Fra_Man_t *p,Fra_Bmc_t *pBmc)

{
  Vec_Ptr_t *pVVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  Aig_Obj_t *pNew;
  long lVar10;
  Aig_Obj_t *pOld;
  Vec_Int_t *vImps;
  uint fComplR;
  uint uVar11;
  void *pvVar12;
  void *pvVar13;
  long lVar14;
  
  if (p->nFramesAll != 1) {
    __assert_fail("p->nFramesAll == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraBmc.c"
                  ,0x80,"void Fra_BmcFilterImplications(Fra_Man_t *, Fra_Bmc_t *)");
  }
  if (p->pManAig != pBmc->pAigFrames) {
    __assert_fail("p->pManAig == pBmc->pAigFrames",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraBmc.c"
                  ,0x81,"void Fra_BmcFilterImplications(Fra_Man_t *, Fra_Bmc_t *)");
  }
  vImps = pBmc->vImps;
  if (0 < vImps->nSize) {
    lVar14 = 0;
    do {
      uVar7 = vImps->pArray[lVar14];
      if (uVar7 != 0) {
        pVVar1 = pBmc->pAig->vObjs;
        if (pVVar1 == (Vec_Ptr_t *)0x0) {
          pvVar12 = (void *)0x0;
          pvVar13 = (void *)0x0;
        }
        else {
          if (((pVVar1->nSize <= (int)(uVar7 & 0xffff)) ||
              (uVar5 = (int)uVar7 >> 0x10, (int)uVar5 < 0)) || ((uint)pVVar1->nSize <= uVar5)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pvVar12 = pVVar1->pArray[(ushort)uVar7];
          pvVar13 = pVVar1->pArray[uVar5];
        }
        lVar10 = (long)pBmc->nPref;
        iVar6 = pBmc->nFramesAll;
        if (pBmc->nPref < iVar6) {
          do {
            lVar2 = *(long *)(*(long *)((long)pvVar12 + 0x28) + 0x40);
            uVar3 = *(ulong *)(*(long *)(lVar2 + 0x30) +
                              ((long)*(int *)(lVar2 + 8) * (long)*(int *)((long)pvVar12 + 0x24) +
                              lVar10) * 8);
            lVar2 = *(long *)(*(long *)((long)pvVar13 + 0x28) + 0x40);
            uVar4 = *(ulong *)(*(long *)(lVar2 + 0x30) +
                              ((long)*(int *)(lVar2 + 8) * (long)*(int *)((long)pvVar13 + 0x24) +
                              lVar10) * 8);
            uVar8 = uVar3 & 0xfffffffffffffffe;
            lVar2 = *(long *)(uVar8 + 0x28);
            uVar8 = *(ulong *)(*(long *)(lVar2 + 0x20) +
                              (long)*(int *)(lVar2 + 0x18) * (long)*(int *)(uVar8 + 0x24) * 8);
            uVar9 = uVar4 & 0xfffffffffffffffe;
            lVar2 = *(long *)(uVar9 + 0x28);
            uVar9 = *(ulong *)(*(long *)(lVar2 + 0x20) +
                              (long)*(int *)(lVar2 + 0x18) * (long)*(int *)(uVar9 + 0x24) * 8);
            uVar11 = ((uint)uVar8 ^ *(uint *)((long)pvVar12 + 0x18) >> 3) & 1;
            uVar5 = (uint)uVar3 & 1;
            uVar7 = uVar11 ^ uVar5;
            fComplR = ((uint)uVar4 ^ *(uint *)((long)pvVar13 + 0x18) >> 3 ^ (uint)uVar9) & 1;
            pOld = (Aig_Obj_t *)(uVar8 & 0xfffffffffffffffe);
            pNew = (Aig_Obj_t *)(uVar9 & 0xfffffffffffffffe);
            if (pOld == pNew) {
              if ((uVar7 != fComplR) &&
                 (((*(uint *)&pOld->field_0x18 & 7) != 1 || (uVar11 == uVar5)))) {
LAB_005f5393:
                vImps = pBmc->vImps;
                if (vImps->nSize <= lVar14) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                                ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
                }
                vImps->pArray[lVar14] = 0;
                goto LAB_005f53ac;
              }
            }
            else {
              iVar6 = Fra_NodesAreImp(p,pOld,pNew,uVar7,fComplR);
              if (iVar6 != 1) goto LAB_005f5393;
              iVar6 = pBmc->nFramesAll;
            }
            lVar10 = lVar10 + 1;
          } while ((int)lVar10 < iVar6);
          vImps = pBmc->vImps;
        }
      }
LAB_005f53ac:
      lVar14 = lVar14 + 1;
    } while (lVar14 < vImps->nSize);
  }
  Fra_ImpCompactArray(vImps);
  return;
}

Assistant:

void Fra_BmcFilterImplications( Fra_Man_t * p, Fra_Bmc_t * pBmc )
{
    Aig_Obj_t * pLeft, * pRight;
    Aig_Obj_t * pLeftT, * pRightT;
    Aig_Obj_t * pLeftF, * pRightF;
    int i, f, Imp, Left, Right;
    int fComplL, fComplR;
    assert( p->nFramesAll == 1 );
    assert( p->pManAig == pBmc->pAigFrames );
    Vec_IntForEachEntry( pBmc->vImps, Imp, i )
    {
        if ( Imp == 0 )
            continue;
        Left  = Fra_ImpLeft(Imp);
        Right = Fra_ImpRight(Imp);
        // get the corresponding nodes
        pLeft  = Aig_ManObj( pBmc->pAig, Left );
        pRight = Aig_ManObj( pBmc->pAig, Right );
        // iterate through the timeframes
        for ( f = pBmc->nPref; f < pBmc->nFramesAll; f++ )
        {
            // get timeframe nodes
            pLeftT  = Bmc_ObjFrames( pLeft, f );
            pRightT = Bmc_ObjFrames( pRight, f );
            // get the corresponding FRAIG nodes
            pLeftF  = Fra_ObjFraig( Aig_Regular(pLeftT), 0 );
            pRightF = Fra_ObjFraig( Aig_Regular(pRightT), 0 );
            // get the complemented attributes
            fComplL = pLeft->fPhase ^ Aig_IsComplement(pLeftF) ^ Aig_IsComplement(pLeftT);
            fComplR = pRight->fPhase ^ Aig_IsComplement(pRightF) ^ Aig_IsComplement(pRightT);
            // check equality
            if ( Aig_Regular(pLeftF) == Aig_Regular(pRightF) )
            {
                if ( fComplL == fComplR ) // x => x  - always true
                    continue;
                assert( fComplL != fComplR );
                // consider 4 possibilities:
                // NOT(1) => 1    or   0 => 1  - always true
                // 1 => NOT(1)    or   1 => 0  - never true
                // NOT(x) => x    or   x       - not always true
                // x => NOT(x)    or   NOT(x)  - not always true
                if ( Aig_ObjIsConst1(Aig_Regular(pLeftF)) && fComplL ) // proved implication
                    continue;
                // disproved implication
                Vec_IntWriteEntry( pBmc->vImps, i, 0 ); 
                break;
            }
            // check the implication 
            if ( Fra_NodesAreImp( p, Aig_Regular(pLeftF), Aig_Regular(pRightF), fComplL, fComplR ) != 1 )
            {
                Vec_IntWriteEntry( pBmc->vImps, i, 0 );
                break;
            }
        }
    }
    Fra_ImpCompactArray( pBmc->vImps );
}